

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

LLVMBBlock * dg::llvmdg::LLVMSlicer::createNewExitBB(LLVMDependenceGraph *graph)

{
  StringRef RHS;
  bool bVar1;
  BBlock<dg::LLVMNode> *pBVar2;
  LLVMNode *this;
  IntegerType *pIVar3;
  Type *pTVar4;
  DependenceGraph<dg::LLVMNode> *in_RDI;
  LLVMNode *newRet;
  ReturnInst *RI;
  Function *F;
  Value *fval;
  BasicBlock *block;
  LLVMContext *Ctx;
  Module *M;
  LLVMBBlock *exitBB;
  LLVMNode *in_stack_ffffffffffffff38;
  StringRef *in_stack_ffffffffffffff40;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff48;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff50;
  BasicBlock *local_98;
  BBlock<dg::LLVMNode> *local_90;
  undefined1 local_78 [16];
  ReturnInst *local_68;
  ret_type local_60;
  Value *local_58;
  Twine local_50;
  BasicBlock *local_28;
  BBlock<dg::LLVMNode> *local_20;
  Module *local_18;
  BBlock<dg::LLVMNode> *local_10;
  DependenceGraph<dg::LLVMNode> *local_8;
  
  local_8 = in_RDI;
  pBVar2 = (BBlock<dg::LLVMNode> *)operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock
            (in_stack_ffffffffffffff50,(LLVMNode *)in_stack_ffffffffffffff48,
             (DependenceGraphT *)in_stack_ffffffffffffff40);
  local_10 = pBVar2;
  local_18 = LLVMDependenceGraph::getModule((LLVMDependenceGraph *)local_8);
  local_20 = (BBlock<dg::LLVMNode> *)llvm::Module::getContext(local_18);
  llvm::Twine::Twine(&local_50,"safe_return");
  local_28 = llvm::BasicBlock::Create
                       ((LLVMContext *)in_stack_ffffffffffffff50,(Twine *)in_stack_ffffffffffffff48,
                        (Function *)in_stack_ffffffffffffff40,
                        (BasicBlock *)in_stack_ffffffffffffff38);
  this = DependenceGraph<dg::LLVMNode>::getEntry(local_8);
  local_58 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey
                       (&this->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
  local_60 = llvm::cast<llvm::Function,llvm::Value>((Value *)0x1d3384);
  llvm::Function::getBasicBlockList(local_60);
  llvm::
  iplist_impl<llvm::simple_ilist<llvm::BasicBlock>,_llvm::SymbolTableListTraits<llvm::BasicBlock>_>
  ::push_back((iplist_impl<llvm::simple_ilist<llvm::BasicBlock>,_llvm::SymbolTableListTraits<llvm::BasicBlock>_>
               *)in_stack_ffffffffffffff50,(pointer)in_stack_ffffffffffffff48);
  llvm::Function::getReturnType((Function *)0x1d33ad);
  bVar1 = llvm::Type::isVoidTy((Type *)0x1d33b5);
  if (bVar1) {
    local_68 = llvm::ReturnInst::Create
                         ((LLVMContext *)in_stack_ffffffffffffff40,
                          (BasicBlock *)in_stack_ffffffffffffff38);
  }
  else {
    local_78 = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    RHS.Length = (size_t)in_stack_ffffffffffffff50;
    RHS.Data = (char *)in_stack_ffffffffffffff48;
    bVar1 = llvm::StringRef::equals(in_stack_ffffffffffffff40,RHS);
    if (bVar1) {
      in_stack_ffffffffffffff50 = local_20;
      pIVar3 = (IntegerType *)llvm::Type::getInt32Ty((LLVMContext *)local_20);
      llvm::ConstantInt::get(pIVar3,0,false);
      local_68 = llvm::ReturnInst::Create
                           ((LLVMContext *)in_stack_ffffffffffffff50,
                            (Value *)in_stack_ffffffffffffff48,
                            (BasicBlock *)in_stack_ffffffffffffff40);
    }
    else {
      in_stack_ffffffffffffff48 = local_20;
      pTVar4 = llvm::Function::getReturnType((Function *)0x1d3474);
      llvm::UndefValue::get(pTVar4);
      local_68 = llvm::ReturnInst::Create
                           ((LLVMContext *)in_stack_ffffffffffffff50,
                            (Value *)in_stack_ffffffffffffff48,
                            (BasicBlock *)in_stack_ffffffffffffff40);
    }
  }
  pBVar2 = (BBlock<dg::LLVMNode> *)operator_new(0x1f0);
  LLVMNode::LLVMNode((LLVMNode *)in_stack_ffffffffffffff50,(Value *)in_stack_ffffffffffffff48,
                     SUB81((ulong)pBVar2 >> 0x38,0));
  local_90 = pBVar2;
  DependenceGraph<dg::LLVMNode>::addNode
            ((DependenceGraph<dg::LLVMNode> *)pBVar2,in_stack_ffffffffffffff38);
  BBlock<dg::LLVMNode>::append(pBVar2,in_stack_ffffffffffffff38);
  local_98 = local_28;
  BBlock<dg::LLVMNode>::setKey(local_10,(KeyT *)&local_98);
  BBlock<dg::LLVMNode>::setDG(local_10,(DependenceGraphT *)local_8);
  return local_10;
}

Assistant:

static LLVMBBlock *createNewExitBB(LLVMDependenceGraph *graph) {
        using namespace llvm;

        LLVMBBlock *exitBB = new LLVMBBlock();

        Module *M = graph->getModule();
        LLVMContext &Ctx = M->getContext();
        BasicBlock *block = BasicBlock::Create(Ctx, "safe_return");

        Value *fval = graph->getEntry()->getKey();
        Function *F = cast<Function>(fval);
        F->getBasicBlockList().push_back(block);

        // fill in basic block just with return value
        ReturnInst *RI;
        if (F->getReturnType()->isVoidTy())
            RI = ReturnInst::Create(Ctx, block);
        else if (F->getName().equals("main"))
            // if this is main, than the safe exit equals to returning 0
            // (it is just for convenience, we wouldn't need to do this)
            RI = ReturnInst::Create(
                    Ctx, ConstantInt::get(Type::getInt32Ty(Ctx), 0), block);
        else
            RI = ReturnInst::Create(Ctx, UndefValue::get(F->getReturnType()),
                                    block);

        LLVMNode *newRet = new LLVMNode(RI);
        graph->addNode(newRet);

        exitBB->append(newRet);
        exitBB->setKey(block);
        exitBB->setDG(graph);

        return exitBB;
    }